

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O2

void __thiscall
Nova::Boundary_Uniform<float,_2>::Find_Ghost_Regions
          (Boundary_Uniform<float,_2> *this,T_Grid *grid,Array<Nova::Range<int,_2>_> *regions,
          int number_of_ghost_cells)

{
  reference pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Range<int,_2> ghost;
  Range<int,_2> domain;
  
  Grid<float,_2>::Cell_Indices((Grid<float,_2> *)&domain,(int)grid);
  Range<int,_2>::Thickened(&ghost,(int)(Grid<float,_2> *)&domain);
  std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::resize(&regions->_data,4)
  ;
  uVar3 = CONCAT44(domain.min_corner._data._M_elems[1],ghost.min_corner._data._M_elems[0]);
  uVar2 = CONCAT44(domain.max_corner._data._M_elems[1],domain.min_corner._data._M_elems[0] + -1);
  pvVar1 = std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::at
                     (&regions->_data,0);
  *(undefined8 *)(pvVar1->min_corner)._data._M_elems = uVar3;
  *(undefined8 *)(pvVar1->max_corner)._data._M_elems = uVar2;
  uVar2 = CONCAT44(domain.min_corner._data._M_elems[1],domain.max_corner._data._M_elems[0] + 1);
  uVar3 = CONCAT44(domain.max_corner._data._M_elems[1],ghost.max_corner._data._M_elems[0]);
  pvVar1 = std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::at
                     (&regions->_data,1);
  *(undefined8 *)(pvVar1->min_corner)._data._M_elems = uVar2;
  *(undefined8 *)(pvVar1->max_corner)._data._M_elems = uVar3;
  uVar2 = CONCAT44(ghost.min_corner._data._M_elems[1],ghost.min_corner._data._M_elems[0]);
  uVar3 = CONCAT44(domain.min_corner._data._M_elems[1] + -1,ghost.max_corner._data._M_elems[0]);
  pvVar1 = std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::at
                     (&regions->_data,2);
  *(undefined8 *)(pvVar1->min_corner)._data._M_elems = uVar2;
  *(undefined8 *)(pvVar1->max_corner)._data._M_elems = uVar3;
  pvVar1 = std::vector<Nova::Range<int,_2>,_std::allocator<Nova::Range<int,_2>_>_>::at
                     (&regions->_data,3);
  *(ulong *)(pvVar1->min_corner)._data._M_elems =
       CONCAT44(domain.max_corner._data._M_elems[1] + 1,ghost.min_corner._data._M_elems[0]);
  *(ulong *)(pvVar1->max_corner)._data._M_elems =
       CONCAT44(ghost.max_corner._data._M_elems[1],ghost.max_corner._data._M_elems[0]);
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Find_Ghost_Regions(const T_Grid& grid,Array<Range<int,d> >& regions,const int number_of_ghost_cells) const
{
    Range<int,d> domain=grid.Cell_Indices(),ghost=domain.Thickened(number_of_ghost_cells);
    regions.resize(T_Grid::number_of_faces_per_cell);
    Find_Ghost_Regions_Helper(regions,domain,ghost);
}